

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridAxis.cpp
# Opt level: O0

bool __thiscall DIS::GridAxis::operator==(GridAxis *this,GridAxis *rhs)

{
  bool local_19;
  bool ivarsEqual;
  GridAxis *rhs_local;
  GridAxis *this_local;
  
  local_19 = true;
  if ((this->_domainInitialXi != rhs->_domainInitialXi) ||
     (NAN(this->_domainInitialXi) || NAN(rhs->_domainInitialXi))) {
    local_19 = false;
  }
  if ((this->_domainFinalXi != rhs->_domainFinalXi) ||
     (NAN(this->_domainFinalXi) || NAN(rhs->_domainFinalXi))) {
    local_19 = false;
  }
  if (this->_domainPointsXi != rhs->_domainPointsXi) {
    local_19 = false;
  }
  if (this->_interleafFactor != rhs->_interleafFactor) {
    local_19 = false;
  }
  if (this->_axisType != rhs->_axisType) {
    local_19 = false;
  }
  if (this->_numberOfPointsOnXiAxis != rhs->_numberOfPointsOnXiAxis) {
    local_19 = false;
  }
  if (this->_initialIndex != rhs->_initialIndex) {
    local_19 = false;
  }
  return local_19;
}

Assistant:

bool GridAxis::operator ==(const GridAxis& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_domainInitialXi == rhs._domainInitialXi) ) ivarsEqual = false;
     if( ! (_domainFinalXi == rhs._domainFinalXi) ) ivarsEqual = false;
     if( ! (_domainPointsXi == rhs._domainPointsXi) ) ivarsEqual = false;
     if( ! (_interleafFactor == rhs._interleafFactor) ) ivarsEqual = false;
     if( ! (_axisType == rhs._axisType) ) ivarsEqual = false;
     if( ! (_numberOfPointsOnXiAxis == rhs._numberOfPointsOnXiAxis) ) ivarsEqual = false;
     if( ! (_initialIndex == rhs._initialIndex) ) ivarsEqual = false;

    return ivarsEqual;
 }